

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O0

bool __thiscall QFSFileEnginePrivate::flushFh(QFSFileEnginePrivate *this)

{
  long lVar1;
  int iVar2;
  undefined4 uVar3;
  QFSFileEngine *pQVar4;
  int *piVar5;
  QFSFileEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  int ret;
  QFSFileEngine *q;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  FileError error;
  undefined4 in_stack_ffffffffffffffb0;
  bool local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = q_func(in_RDI);
  error = (FileError)((ulong)pQVar4 >> 0x20);
  if ((in_RDI->lastFlushFailed & 1U) == 0) {
    iVar2 = fflush((FILE *)in_RDI->fh);
    in_RDI->lastFlushFailed = iVar2 != 0;
    in_RDI->lastIOCommand = IOFlushCommand;
    if (iVar2 == 0) {
      local_21 = true;
    }
    else {
      piVar5 = __errno_location();
      uVar3 = 2;
      if (*piVar5 == 0x1c) {
        uVar3 = 4;
      }
      __errno_location();
      QSystemError::stdString(error);
      QAbstractFileEngine::setError
                ((QAbstractFileEngine *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),error,
                 (QString *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
      QString::~QString((QString *)0x124a9b);
      local_21 = false;
    }
  }
  else {
    local_21 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEnginePrivate::flushFh()
{
    Q_Q(QFSFileEngine);

    // Never try to flush again if the last flush failed. Otherwise you can
    // get crashes on some systems (AIX).
    if (lastFlushFailed)
        return false;

    int ret = fflush(fh);

    lastFlushFailed = (ret != 0);
    lastIOCommand = QFSFileEnginePrivate::IOFlushCommand;

    if (ret != 0) {
        q->setError(errno == ENOSPC ? QFile::ResourceError : QFile::WriteError,
                    QSystemError::stdString(errno));
        return false;
    }
    return true;
}